

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O0

int CVmObjByteArray::read_from_data_file(vm_val_t *retval,CVmDataSource *fp)

{
  int iVar1;
  vm_obj_id_t obj;
  unsigned_long uVar2;
  unsigned_long uVar3;
  long *in_RSI;
  vm_val_t *in_RDI;
  int unaff_retaddr;
  unsigned_long in_stack_00000008;
  unsigned_long len;
  CVmObjByteArray *arr;
  char buf [16];
  unsigned_long in_stack_ffffffffffffffb8;
  undefined1 local_28 [24];
  vm_val_t *local_10;
  int local_4;
  
  local_10 = in_RDI;
  iVar1 = (**(code **)(*in_RSI + 0x10))(in_RSI,local_28,4);
  if (iVar1 == 0) {
    uVar2 = ::osrp4(local_28);
    obj = create((int)((ulong)local_10 >> 0x20),in_stack_ffffffffffffffb8);
    vm_val_t::set_obj(local_10,obj);
    vm_objp(0);
    uVar3 = read_from_file((CVmObjByteArray *)buf._8_8_,buf._4_4_,(CVmDataSource *)arr,len,
                           in_stack_00000008,unaff_retaddr);
    if (uVar3 == (uVar2 & 0xffffffff)) {
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int CVmObjByteArray::read_from_data_file(VMG_ vm_val_t *retval,
                                         CVmDataSource *fp)
{
    char buf[16];
    CVmObjByteArray *arr;
    unsigned long len;

    /* read the number of bytes in the array */
    if (fp->read(buf, 4))
        return 1;
    len = t3rp4u(buf);

    /* create a new ByteArray to hold the result */
    retval->set_obj(create(vmg_ FALSE, len));
    arr = (CVmObjByteArray *)vm_objp(vmg_ retval->val.obj);

    /* read the bytes (it's a new object, so don't save undo) */
    if (arr->read_from_file(vmg_ retval->val.obj, fp, 1, len, FALSE) != len)
    {
        /* 
         *   we didn't manage to read all of the bytes - since the value was
         *   tagged with the correct number of bytes, end-of-file in the
         *   middle of the bytes indicates a corrupted file, so return
         *   failure 
         */
        return 1;
    }

    /* success */
    return 0;
}